

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

char ** gen_options(uint program)

{
  uint uVar1;
  int iVar2;
  option_type_t oVar3;
  ulong uVar4;
  char **ptr;
  char *pcVar5;
  size_t sVar6;
  char *__dest;
  ushort **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  option_t *poVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  char buf [4096];
  char local_1038 [4104];
  
  if (program == 0) {
    ptr = (char **)0x0;
  }
  else {
    ptr = (char **)mmalloc(0x10);
    pcVar5 = (char *)mmalloc(5);
    *ptr = pcVar5;
    ptr[1] = (char *)0x0;
    if (program == 1) {
      builtin_strncpy(pcVar5,"gbas",5);
    }
    else {
      builtin_strncpy(pcVar5,"gbld",5);
    }
    uVar12 = 1;
    lVar13 = 0;
    do {
      uVar1 = uVar12;
      if (options[lVar13].set != 0) {
        poVar10 = options + lVar13;
        if (program == 1) {
          iVar2 = options[lVar13].as_opt;
joined_r0x00108cde:
          if (iVar2 == 0) goto LAB_00108e72;
        }
        else if (program == 2) {
          iVar2 = options[lVar13].ld_opt;
          goto joined_r0x00108cde;
        }
        uVar11 = uVar12 + 1;
        uVar1 = uVar12 + 2;
        ptr = (char **)mrealloc(ptr,(ulong)uVar1 * 8);
        ptr[uVar11] = (char *)0x0;
        oVar3 = options[lVar13].type;
        if (oVar3 == string) {
          ptr = (char **)mrealloc(ptr,(ulong)(uVar12 + 3) << 3);
          ptr[uVar1] = (char *)0x0;
          pcVar5 = options[lVar13].value.str;
          sVar6 = strlen(pcVar5);
          if (sVar6 != 0) {
            ppuVar7 = __ctype_b_loc();
            uVar4 = 1;
            uVar9 = 0;
            do {
              uVar8 = uVar4;
              if ((*(byte *)((long)*ppuVar7 + (long)pcVar5[uVar9] * 2 + 1) & 0x20) != 0) {
                sprintf(local_1038,"\"%s\"",pcVar5);
                goto LAB_00108e0c;
              }
              uVar4 = (ulong)((int)uVar8 + 1);
              uVar9 = uVar8;
            } while (uVar8 < sVar6);
          }
          strcpy(local_1038,pcVar5);
LAB_00108e0c:
          sVar6 = strlen(poVar10->name);
          pcVar5 = (char *)mmalloc(sVar6 + 1);
          ptr[uVar12] = pcVar5;
          sVar6 = strlen(local_1038);
          pcVar5 = (char *)mmalloc(sVar6 + 1);
          ptr[uVar11] = pcVar5;
          strcpy(ptr[uVar12],poVar10->name);
          strcpy(ptr[uVar11],local_1038);
        }
        else {
          uVar1 = uVar11;
          if (oVar3 == number) {
            pcVar5 = local_1038;
            sprintf(pcVar5,"%s%d",poVar10->name,(ulong)(uint)options[lVar13].value.num);
            sVar6 = strlen(pcVar5);
            __dest = (char *)mmalloc(sVar6 + 1);
            ptr[uVar12] = __dest;
          }
          else {
            if (oVar3 != flag) goto LAB_00108e72;
            sVar6 = strlen(poVar10->name);
            __dest = (char *)mmalloc(sVar6 + 1);
            ptr[uVar12] = __dest;
            pcVar5 = poVar10->name;
          }
          strcpy(__dest,pcVar5);
        }
      }
LAB_00108e72:
      uVar12 = uVar1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
  }
  return ptr;
}

Assistant:

char** gen_options(unsigned program)
{
    unsigned i, num_opts = 1;
    char buf[PATH_MAX];
    
    if (program == GBCC)
        return NULL;
    char** opts = (char**)mmalloc((num_opts+1) * sizeof(char*));
    opts[0] = (char*)mmalloc(5);
    opts[1] = NULL;
    
    if (program == GBAS)
        strcpy(opts[0], "gbas");
    else
        strcpy(opts[0], "gbld");
    
    for (i = 0; i < NUM_OPTIONS; ++i)
    {
        if (!options[i].set)
            continue;
        if (program == GBAS && !options[i].as_opt)
            continue;
        if (program == GBLD && !options[i].ld_opt)
            continue;
        
        opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
        opts[num_opts] = NULL;
        
        if (options[i].type == flag)    /* -opt */
        {
            opts[num_opts-1] = (char*)mmalloc(strlen(options[i].name) + 1);
            strcpy(opts[num_opts-1], options[i].name);
        }
        else if (options[i].type == number) /* -opt=<number> */
        {
            sprintf(buf, "%s%d", options[i].name, options[i].value.num);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            strcpy(opts[num_opts-1], buf);
        }
        else if (options[i].type == string) /* -opt <string> */
        {
            unsigned j;
            int delim = 0;
            
            opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
            opts[num_opts] = NULL;
            
            for (j = 0; j < strlen(options[i].value.str); ++j)
            {
                if (isspace(options[i].value.str[j]))
                {
                    delim = 1;
                    break;
                }
            }
            
            if (delim)
                sprintf(buf, "\"%s\"", options[i].value.str);
            else
                strcpy(buf, options[i].value.str);
            
            opts[num_opts-2] = (char*)mmalloc(strlen(options[i].name) + 1);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            
            strcpy(opts[num_opts-2], options[i].name);
            strcpy(opts[num_opts-1], buf);
        }
    }

    return opts;
}